

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

PowerParameter * __thiscall caffe::V1LayerParameter::mutable_power_param(V1LayerParameter *this)

{
  PowerParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_power_param(this);
  if (this->power_param_ == (PowerParameter *)0x0) {
    this_00 = (PowerParameter *)operator_new(0x28);
    PowerParameter::PowerParameter(this_00);
    this->power_param_ = this_00;
  }
  return this->power_param_;
}

Assistant:

inline ::caffe::PowerParameter* V1LayerParameter::mutable_power_param() {
  set_has_power_param();
  if (power_param_ == NULL) {
    power_param_ = new ::caffe::PowerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.power_param)
  return power_param_;
}